

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

intptr_t http_connect(char *url,char *unix_address,http_settings_s arg_settings)

{
  fio_str_info_s n;
  http_settings_s arg_settings_00;
  bool bVar1;
  undefined1 auVar2 [24];
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  char *__dest;
  int *piVar6;
  http_settings_s *phVar7;
  http_s *r;
  void *pvVar8;
  FIOBJ FVar9;
  FIOBJ FVar10;
  fio_connect_args *pfVar11;
  intptr_t iVar12;
  long lVar13;
  char *pcVar14;
  undefined8 *puVar15;
  bool bVar16;
  byte bVar17;
  timespec tVar18;
  size_t sStackY_250;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  undefined8 in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdf0 [72];
  FIOBJ local_1c0;
  char *local_1b8;
  fio_url_s u;
  fio_connect_args local_a0;
  fio_connect_args local_68;
  
  bVar17 = 0;
  if (arg_settings.on_upgrade == (_func_void_http_s_ptr_char_ptr_size_t *)0x0 &&
      arg_settings.on_response == (_func_void_http_s_ptr *)0x0) {
    if (FIO_LOG_LEVEL < 2) goto LAB_0013ff84;
    pcVar14 = "ERROR: http_connect requires either an on_response  or an on_upgrade callback.\n";
  }
  else {
    if (url != (char *)0x0 || unix_address != (char *)0x0) {
      if (url == (char *)0x0) {
        bVar1 = true;
        sVar5 = 0;
        local_1b8 = (char *)0x0;
        __dest = (char *)0x0;
        pcVar14 = (char *)0x0;
        local_1c0 = 0;
        goto LAB_0013fffd;
      }
      sVar5 = strlen(url);
      fio_url_parse(&u,url,sVar5);
      if (u.scheme.data == (char *)0x0) {
switchD_0013fd9e_default:
        bVar16 = false;
        bVar1 = false;
      }
      else {
        switch(u.scheme.len) {
        case 2:
switchD_0013fd9e_caseD_2:
          if ((*u.scheme.data == 'w') && (u.scheme.data[1] == 's')) {
            bVar1 = true;
            sStackY_250 = 3;
LAB_0013fe56:
            bVar16 = u.scheme.len == sStackY_250;
            if ((bVar16) && (arg_settings.tls == (void *)0x0)) {
              if (1 < FIO_LOG_LEVEL) {
                FIO_LOG2STDERR("ERROR: Secure connections (%.*s) require a TLS object.");
              }
              goto LAB_0013ff84;
            }
          }
          else {
            if (u.scheme.len == 4) goto switchD_0013fd9e_caseD_4;
            bVar16 = false;
            bVar1 = false;
            if (u.scheme.len == 5) goto switchD_0013fd9e_caseD_5;
          }
          break;
        case 3:
          bVar16 = false;
          bVar1 = false;
          if (u.scheme.data[2] == 's') goto switchD_0013fd9e_caseD_2;
          break;
        case 4:
switchD_0013fd9e_caseD_4:
          bVar16 = false;
          bVar1 = false;
          if (((*u.scheme.data == 'h') && (bVar16 = false, u.scheme.data[1] == 't')) &&
             (bVar16 = false, u.scheme.data[2] == 't')) {
            bVar1 = false;
            if (u.scheme.data[3] == 'p') {
              sStackY_250 = 5;
              bVar1 = false;
              goto LAB_0013fe56;
            }
            bVar16 = false;
          }
          break;
        case 5:
switchD_0013fd9e_caseD_5:
          bVar16 = false;
          bVar1 = false;
          if (u.scheme.data[4] == 's') goto switchD_0013fd9e_caseD_4;
          break;
        default:
          goto switchD_0013fd9e_default;
        }
      }
      if (u.path.data == (char *)0x0) {
        local_1c0 = 0;
      }
      else {
        sVar5 = strlen(u.path.data);
        local_1c0 = fiobj_str_new(u.path.data,sVar5);
      }
      if (unix_address == (char *)0x0) {
        if (u.host.data == (char *)0x0) goto LAB_0013ff6d;
        local_1b8 = (char *)fio_malloc(u.host.len + 1);
        sVar4 = u.host.len;
        memcpy(local_1b8,u.host.data,u.host.len);
        local_1b8[sVar4] = '\0';
        if (u.port.data == (char *)0x0) {
          if (bVar16) {
            __dest = (char *)fio_malloc(4);
            builtin_strncpy(__dest,"443",4);
          }
          else {
            __dest = (char *)fio_malloc(3);
            __dest[0] = '8';
            __dest[1] = '0';
            __dest[2] = '\0';
          }
        }
        else {
          __dest = (char *)fio_malloc(u.port.len + 1);
          memcpy(__dest,u.port.data,u.port.len);
          __dest[u.port.len] = '\0';
        }
        sVar5 = 0;
      }
      else {
        sVar5 = strlen(unix_address);
        __dest = (char *)0x0;
        local_1b8 = unix_address;
      }
      pcVar14 = unix_address;
      if (u.host.data != (char *)0x0) {
        sVar5 = u.host.len;
        pcVar14 = u.host.data;
      }
      bVar1 = !bVar1;
LAB_0013fffd:
      if (arg_settings.timeout == '\0') {
        arg_settings.timeout = '\x1e';
      }
      phVar7 = &arg_settings;
      puVar15 = (undefined8 *)&stack0xfffffffffffffdb8;
      for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar15 = phVar7->on_request;
        phVar7 = (http_settings_s *)((long)phVar7 + (ulong)bVar17 * -0x10 + 8);
        puVar15 = puVar15 + (ulong)bVar17 * -2 + 1;
      }
      arg_settings_00.on_upgrade =
           (_func_void_http_s_ptr_char_ptr_size_t *)in_stack_fffffffffffffdc0;
      arg_settings_00.on_request = (_func_void_http_s_ptr *)in_stack_fffffffffffffdb8;
      arg_settings_00.on_response = (_func_void_http_s_ptr *)in_stack_fffffffffffffdc8;
      arg_settings_00.on_finish = (_func_void_http_settings_s_ptr *)in_stack_fffffffffffffdd0;
      arg_settings_00.udata = (void *)in_stack_fffffffffffffdd8;
      arg_settings_00.public_folder = (char *)in_stack_fffffffffffffde0;
      arg_settings_00.public_folder_length = in_stack_fffffffffffffde8;
      arg_settings_00.max_header_size = in_stack_fffffffffffffdf0._0_8_;
      arg_settings_00.max_body_size = in_stack_fffffffffffffdf0._8_8_;
      arg_settings_00.max_clients = in_stack_fffffffffffffdf0._16_8_;
      arg_settings_00.tls = (void *)in_stack_fffffffffffffdf0._24_8_;
      arg_settings_00.reserved1 = in_stack_fffffffffffffdf0._32_8_;
      arg_settings_00.reserved2 = in_stack_fffffffffffffdf0._40_8_;
      arg_settings_00.reserved3 = in_stack_fffffffffffffdf0._48_8_;
      arg_settings_00.ws_max_msg_size = in_stack_fffffffffffffdf0._56_8_;
      arg_settings_00.timeout = in_stack_fffffffffffffdf0[0x40];
      arg_settings_00.ws_timeout = in_stack_fffffffffffffdf0[0x41];
      arg_settings_00.log = in_stack_fffffffffffffdf0[0x42];
      arg_settings_00.is_client = in_stack_fffffffffffffdf0[0x43];
      arg_settings_00._124_4_ = in_stack_fffffffffffffdf0._68_4_;
      phVar7 = http_settings_new(arg_settings_00);
      phVar7->is_client = '\x01';
      if (arg_settings.ws_timeout == '\0') {
        phVar7->ws_timeout = '\0';
      }
      if (arg_settings.timeout == '\0') {
        phVar7->timeout = '\0';
      }
      r = (http_s *)fio_malloc(0x80);
      if (r != (http_s *)0x0) {
        pvVar8 = http1_vtable();
        FVar9 = fiobj_hash_new();
        tVar18 = fio_last_tick();
        FVar10 = fiobj_hash_new();
        pvVar3 = arg_settings.tls;
        (r->private_data).vtbl = pvVar8;
        (r->private_data).flag = 0;
        (r->private_data).out_headers = FVar9;
        r->received_at = tVar18;
        r->method = 0;
        r->status_str = 0;
        r->version = 0;
        r->query = 0;
        r->headers = FVar10;
        r->cookies = 0;
        r->params = 0;
        r->body = 0;
        r->udata = (void *)0x0;
        r->udata = arg_settings.udata;
        r->status = 0;
        r->path = local_1c0;
        phVar7->udata = r;
        phVar7->tls = arg_settings.tls;
        if (pcVar14 != (char *)0x0) {
          n.data = "host";
          n.capa = SUB168(ZEXT816(4) << 0x40,0);
          n.len = SUB168(ZEXT816(4) << 0x40,8);
          auVar2._8_8_ = pcVar14;
          auVar2._0_8_ = sVar5;
          auVar2._16_8_ = 0;
          http_set_header2(r,n,(fio_str_info_s)(auVar2 << 0x40));
        }
        if (bVar1) {
          pfVar11 = &local_a0;
        }
        else {
          pfVar11 = &local_68;
        }
        pfVar11->address = local_1b8;
        pfVar11->port = __dest;
        pfVar11->on_connect = http_on_open_client;
        pfVar11->on_fail = http_on_client_failed;
        pfVar11->tls = pvVar3;
        pfVar11->udata = phVar7;
        pfVar11->timeout = '\0';
        iVar12 = fio_connect(*pfVar11);
        if (local_1b8 != unix_address) {
          fio_free(local_1b8);
        }
        fio_free(__dest);
        return iVar12;
      }
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http.c:1123) HTTP Client handler allocation failed"
                      );
      }
      perror("     errno");
      exit(-1);
    }
LAB_0013ff6d:
    if (FIO_LOG_LEVEL < 2) goto LAB_0013ff84;
    pcVar14 = "ERROR: http_connect requires a valid address.";
  }
  FIO_LOG2STDERR(pcVar14);
LAB_0013ff84:
  piVar6 = __errno_location();
  *piVar6 = 0x16;
  if (arg_settings.on_finish != (_func_void_http_settings_s_ptr *)0x0) {
    (*arg_settings.on_finish)(&arg_settings);
  }
  return -1;
}

Assistant:

intptr_t http_connect FIO_IGNORE_MACRO(const char *url,
                                       const char *unix_address,
                                       struct http_settings_s arg_settings) {
  if (!arg_settings.on_response && !arg_settings.on_upgrade) {
    FIO_LOG_ERROR("http_connect requires either an on_response "
                  " or an on_upgrade callback.\n");
    errno = EINVAL;
    goto on_error;
  }
  size_t len = 0, h_len = 0;
  char *a = NULL, *p = NULL, *host = NULL;
  uint8_t is_websocket = 0;
  uint8_t is_secure = 0;
  FIOBJ path = FIOBJ_INVALID;
  if (!url && !unix_address) {
    FIO_LOG_ERROR("http_connect requires a valid address.");
    errno = EINVAL;
    goto on_error;
  }
  if (url) {
    fio_url_s u = fio_url_parse(url, strlen(url));
    if (u.scheme.data &&
        (u.scheme.len == 2 || (u.scheme.len == 3 && u.scheme.data[2] == 's')) &&
        u.scheme.data[0] == 'w' && u.scheme.data[1] == 's') {
      is_websocket = 1;
      is_secure = (u.scheme.len == 3);
    } else if (u.scheme.data &&
               (u.scheme.len == 4 ||
                (u.scheme.len == 5 && u.scheme.data[4] == 's')) &&
               u.scheme.data[0] == 'h' && u.scheme.data[1] == 't' &&
               u.scheme.data[2] == 't' && u.scheme.data[3] == 'p') {
      is_secure = (u.scheme.len == 5);
    }
    if (is_secure && !arg_settings.tls) {
      FIO_LOG_ERROR("Secure connections (%.*s) require a TLS object.",
                    (int)u.scheme.len, u.scheme.data);
      errno = EINVAL;
      goto on_error;
    }
    if (u.path.data) {
      path = fiobj_str_new(
          u.path.data, strlen(u.path.data)); /* copy query and target as well */
    }
    if (unix_address) {
      a = (char *)unix_address;
      h_len = len = strlen(a);
      host = a;
    } else {
      if (!u.host.data) {
        FIO_LOG_ERROR("http_connect requires a valid address.");
        errno = EINVAL;
        goto on_error;
      }
      /***** no more error handling, since memory is allocated *****/
      /* copy address */
      a = fio_malloc(u.host.len + 1);
      memcpy(a, u.host.data, u.host.len);
      a[u.host.len] = 0;
      len = u.host.len;
      /* copy port */
      if (u.port.data) {
        p = fio_malloc(u.port.len + 1);
        memcpy(p, u.port.data, u.port.len);
        p[u.port.len] = 0;
      } else if (is_secure) {
        p = fio_malloc(3 + 1);
        memcpy(p, "443", 3);
        p[3] = 0;
      } else {
        p = fio_malloc(2 + 1);
        memcpy(p, "80", 2);
        p[2] = 0;
      }
    }
    if (u.host.data) {
      host = u.host.data;
      h_len = u.host.len;
    }
  }

  /* set settings */
  if (!arg_settings.timeout)
    arg_settings.timeout = 30;
  http_settings_s *settings = http_settings_new(arg_settings);
  settings->is_client = 1;
  // if (settings->tls) {
  //   fio_tls_alpn_add(settings->tls, "http/1.1", http_on_open_client_http1,
  //                     NULL, NULL);
  // }

  if (!arg_settings.ws_timeout)
    settings->ws_timeout = 0; /* allow server to dictate timeout */
  if (!arg_settings.timeout)
    settings->timeout = 0; /* allow server to dictate timeout */
  http_s *h = fio_malloc(sizeof(*h));
  FIO_ASSERT(h, "HTTP Client handler allocation failed");
  http_s_new(h, 0, http1_vtable());
  h->udata = arg_settings.udata;
  h->status = 0;
  h->path = path;
  settings->udata = h;
  settings->tls = arg_settings.tls;
  if (host)
    http_set_header2(h, (fio_str_info_s){.data = (char *)"host", .len = 4},
                     (fio_str_info_s){.data = host, .len = h_len});
  intptr_t ret;
  if (is_websocket) {
    /* force HTTP/1.1 */
    ret = fio_connect(.address = a, .port = p, .on_fail = http_on_client_failed,
                      .on_connect = http_on_open_client, .udata = settings,
                      .tls = arg_settings.tls);
    (void)0;
  } else {
    /* Allow for any HTTP version */
    ret = fio_connect(.address = a, .port = p, .on_fail = http_on_client_failed,
                      .on_connect = http_on_open_client, .udata = settings,
                      .tls = arg_settings.tls);
    (void)0;
  }
  if (a != unix_address)
    fio_free(a);
  fio_free(p);
  return ret;
on_error:
  if (arg_settings.on_finish)
    arg_settings.on_finish(&arg_settings);
  return -1;
}